

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

axbStatus_t
host_copyout(void *src,axbDataType_t src_type,void *dest,axbDataType_t dest_type,size_t n,
            void *aux_data)

{
  axbStatus_t aVar1;
  size_t sVar2;
  
  aVar1 = 0x40ce;
  if ((((src_type & ~AXB_REAL_FLOAT) == AXB_INT_32) &&
      (aVar1 = 0x40cf, (dest_type & ~AXB_REAL_FLOAT) == AXB_INT_32)) &&
     (aVar1 = 0x40d0, src_type == dest_type)) {
    aVar1 = 0;
    if (src_type == AXB_INT_32) {
      if (n != 0) {
        aVar1 = 0;
        sVar2 = 0;
        do {
          *(undefined4 *)((long)dest + sVar2 * 4) = *(undefined4 *)((long)src + sVar2 * 4);
          sVar2 = sVar2 + 1;
        } while (n != sVar2);
      }
    }
    else if ((src_type == AXB_REAL_DOUBLE) && (n != 0)) {
      aVar1 = 0;
      sVar2 = 0;
      do {
        *(undefined8 *)((long)dest + sVar2 * 8) = *(undefined8 *)((long)src + sVar2 * 8);
        sVar2 = sVar2 + 1;
      } while (n != sVar2);
    }
  }
  return aVar1;
}

Assistant:

static axbStatus_t host_copyout(void *src, axbDataType_t src_type, void *dest, axbDataType_t dest_type, size_t n, void *aux_data)
{
  if ( src_type != AXB_INT_32 &&  src_type != AXB_REAL_DOUBLE) return 16590; // not yet supported
  if (dest_type != AXB_INT_32 && dest_type != AXB_REAL_DOUBLE) return 16591; // not yet supported
  if ( src_type != dest_type) return 16592; // not yet supported

  if (src_type == AXB_INT_32) {
    int *d_src  = src;
    int *d_dest = dest;
    for (size_t i=0; i<n; ++i)
      d_dest[i] = d_src[i];
  } else if (src_type == AXB_REAL_DOUBLE) {
    double *d_src  = src;
    double *d_dest = dest;
    for (size_t i=0; i<n; ++i)
      d_dest[i] = d_src[i];
  }

  (void)aux_data;
  return 0;
}